

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_15::XmlReporter::log_message(XmlReporter *this,MessageData *mb)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Enum EVar3;
  int iVar4;
  _Alloc_hider this_01;
  undefined8 uVar5;
  char *pcVar6;
  pointer unaff_RBP;
  _Alloc_hider unaff_R14;
  string local_c0;
  string local_a0;
  pthread_mutex_t *local_80;
  string local_78;
  string local_58;
  uint local_34;
  
  local_80 = (pthread_mutex_t *)&this->mutex;
  iVar4 = pthread_mutex_lock(local_80);
  if (iVar4 != 0) {
    uVar5 = std::__throw_system_error(iVar4);
    if (local_a0._M_dataplus._M_p != unaff_RBP) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      unaff_R14._M_p = local_78._M_dataplus._M_p;
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)unaff_R14._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock(local_80);
    _Unwind_Resume(uVar5);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Message","");
  this_00 = &this->xml;
  XmlWriter::startElement(this_00,&local_c0);
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"type","");
  EVar3 = mb->m_severity;
  if ((EVar3 & is_warn) == 0) {
    if ((EVar3 & is_check) == 0) {
      pcVar6 = "FATAL ERROR";
      if ((EVar3 & is_require) == 0) {
        pcVar6 = "";
      }
    }
    else {
      pcVar6 = "ERROR";
    }
  }
  else {
    pcVar6 = "WARNING";
  }
  XmlWriter::writeAttribute(this_00,&local_a0,pcVar6);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"filename","");
  pcVar6 = skipPathFromFilename(mb->m_file);
  XmlWriter::writeAttribute(this_00,&local_78,pcVar6);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"line","");
  local_34 = 0;
  if (this->opt->no_line_numbers == false) {
    local_34 = mb->m_line;
  }
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_58,&local_34);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Text","");
  local_78._M_dataplus._M_p = &this_00->m_tagIsOpen;
  XmlWriter::startElement(this_00,&local_c0);
  if ((mb->m_string).field_0.buf[0x17] < '\0') {
    mb = (MessageData *)(mb->m_string).field_0.data.ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,(char *)mb,(allocator<char> *)&local_58);
  XmlWriter::ScopedElement::writeText((ScopedElement *)&local_78,&local_a0,true);
  this_01._M_p = &this_00->m_tagIsOpen;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    this_01._M_p = local_78._M_dataplus._M_p;
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_01._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  log_contexts(this);
  XmlWriter::endElement(this_00);
  pthread_mutex_unlock(local_80);
  return;
}

Assistant:

void log_message(const MessageData& mb) override {
            DOCTEST_LOCK_MUTEX(mutex)

            xml.startElement("Message")
                    .writeAttribute("type", failureString(mb.m_severity))
                    .writeAttribute("filename", skipPathFromFilename(mb.m_file))
                    .writeAttribute("line", line(mb.m_line));

            xml.scopedElement("Text").writeText(mb.m_string.c_str());

            log_contexts();

            xml.endElement();
        }